

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dept.h
# Opt level: O3

void __thiscall Department::print(Department *this,string *group_id,int day_id)

{
  size_t __n;
  int iVar1;
  ostream *poVar2;
  mapped_type *this_00;
  _Rb_tree_node_base *p_Var3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>
  *__p;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>
  element;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>
  local_d0;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dept_id: ",9);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,*(char **)this,*(long *)(this + 8));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  __n = group_id->_M_string_length;
  if (__n == default_group_abi_cxx11_._M_string_length) {
    if (__n != 0) {
      iVar1 = bcmp((group_id->_M_dataplus)._M_p,default_group_abi_cxx11_._M_dataplus._M_p,__n);
      if (iVar1 != 0) goto LAB_0010d9f6;
    }
    p_Var3 = *(_Rb_tree_node_base **)(this + 0x38);
    if (p_Var3 != (_Rb_tree_node_base *)(this + 0x28)) {
      do {
        __p = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>
               *)(p_Var3 + 1);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>
        ::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group,_true>
                  (&local_d0,__p);
        Group::print(&local_d0.second,(int)__p);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_d0.second.lesson_set._M_t);
        std::vector<Lesson,_std::allocator<Lesson>_>::~vector(&local_d0.second.lesson_map);
        std::vector<Day,_std::allocator<Day>_>::~vector(&local_d0.second.days);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.second.groupNumber._M_dataplus._M_p != &local_d0.second.groupNumber.field_2)
        {
          operator_delete(local_d0.second.groupNumber._M_dataplus._M_p,
                          local_d0.second.groupNumber.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.first._M_dataplus._M_p != &local_d0.first.field_2) {
          operator_delete(local_d0.first._M_dataplus._M_p,
                          local_d0.first.field_2._M_allocated_capacity + 1);
        }
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      } while (p_Var3 != (_Rb_tree_node_base *)(this + 0x28));
    }
    return;
  }
LAB_0010d9f6:
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>_>_>
                          *)(this + 0x20),group_id);
  Group::print(this_00,(int)group_id);
  return;
}

Assistant:

void Department::print(std::string group_id, int day_id) {

    //print a group
    std::cout << "dept_id: " << deptNumber << std::endl;
    if (group_id != default_group) {
        groups[group_id].print(day_id);
    }
    //print all groups
    else {

        for (std::pair<std::string, Group> element : groups) {
            element.second.print(day_id);
            std::cout << std::endl;
        }
    }

}